

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClipboardImpl.cpp
# Opt level: O2

void __thiscall sf::priv::ClipboardImpl::processEventsImpl(ClipboardImpl *this)

{
  _Elt_pointer __src;
  int iVar1;
  XEvent event;
  value_type local_e0;
  
  while( true ) {
    iVar1 = XCheckIfEvent(this->m_display,&local_e0,anon_unknown.dwarf_11586c::checkEvent,
                          this->m_window);
    if (iVar1 == 0) break;
    std::deque<_XEvent,_std::allocator<_XEvent>_>::push_back(&this->m_events,&local_e0);
  }
  while (__src = (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur,
        (this->m_events).super__Deque_base<_XEvent,_std::allocator<_XEvent>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != __src) {
    memcpy(&local_e0,__src,0xc0);
    std::deque<_XEvent,_std::allocator<_XEvent>_>::pop_front(&this->m_events);
    processEvent(this,&local_e0);
  }
  return;
}

Assistant:

void ClipboardImpl::processEventsImpl()
{
    XEvent event;

    // Pick out the events that are interesting for this window
    while (XCheckIfEvent(m_display, &event, &checkEvent, reinterpret_cast<XPointer>(m_window)))
        m_events.push_back(event);

    // Handle the events for this window that we just picked out
    while (!m_events.empty())
    {
        event = m_events.front();
        m_events.pop_front();
        processEvent(event);
    }
}